

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

FunctionTableHolder * __thiscall
ImageTypeManager::functionTable(ImageTypeManager *this,uint8_t type)

{
  bool bVar1;
  iterator this_00;
  undefined8 uVar2;
  pointer ppVar3;
  const_iterator table;
  map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
  *in_stack_ffffffffffffffa8;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
  in_stack_ffffffffffffffd8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
  local_18 [3];
  
  this_00 = std::
            map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
            ::find(in_stack_ffffffffffffffa8,(key_type *)0x1104e4);
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
  ::_Rb_tree_const_iterator(local_18,(iterator *)&stack0xffffffffffffffe0);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_Image_Function_Helper::FunctionTableHolder,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>_>
       ::end(in_stack_ffffffffffffffa8);
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
              *)&stack0xffffffffffffffd8,&local_30);
  bVar1 = std::operator==(local_18,(_Self *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_char,_Image_Function_Helper::FunctionTableHolder>_>
                           *)0x11058a);
    return &ppVar3->second;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  imageException::imageException
            ((imageException *)this_00._M_node,(char *)in_stack_ffffffffffffffd8._M_node);
  __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

const Image_Function_Helper::FunctionTableHolder & ImageTypeManager::functionTable( uint8_t type )
{
    std::map< uint8_t, Image_Function_Helper::FunctionTableHolder >::const_iterator table = _functionTableMap.find( type );
    if ( table == _functionTableMap.end() )
        throw imageException( "Function table is not initialised" );

    return table->second;
}